

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O3

wchar_t check_symlinks_fsobj(char *path,wchar_t *a_eno,archive_string *a_estr,wchar_t flags)

{
  int fd;
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  char *pcVar4;
  wchar_t *pwVar5;
  char *pcVar6;
  char cVar7;
  bool bVar8;
  stat_conflict st;
  stat local_c0;
  
  if (*path == '\0') {
    wVar2 = L'\0';
  }
  else {
    fd = open(".",0x80000);
    __archive_ensure_cloexec_flag(fd);
    if (-1 < fd) {
      pcVar3 = path + (*path == '/');
      pcVar6 = path;
LAB_003cf28f:
      pcVar4 = pcVar3 + -1;
      do {
        cVar7 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
      } while (cVar7 == '/');
      while (cVar7 != '\0') {
        if (cVar7 == '/') {
          bVar8 = pcVar4[1] == '\0';
          goto LAB_003cf2c5;
        }
        pcVar3 = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
        cVar7 = *pcVar3;
      }
      bVar8 = true;
LAB_003cf2c5:
      *pcVar4 = '\0';
      iVar1 = lstat(pcVar6,&local_c0);
      if (iVar1 == 0) {
        if ((local_c0.st_mode & 0xf000) != 0xa000) {
          if ((local_c0.st_mode & 0xf000) == 0x4000) {
            if (bVar8) {
              *pcVar4 = cVar7;
              goto LAB_003cf478;
            }
LAB_003cf340:
            iVar1 = chdir(pcVar6);
            if (iVar1 != 0) {
              *pcVar4 = cVar7;
              if (a_eno != (wchar_t *)0x0) {
                pwVar5 = __errno_location();
                *a_eno = *pwVar5;
              }
              wVar2 = L'\xffffffe2';
              if (a_estr != (archive_string *)0x0) {
                pcVar6 = "Could not chdir ";
                goto LAB_003cf509;
              }
              goto LAB_003cf518;
            }
            pcVar6 = pcVar4 + 1;
          }
LAB_003cf366:
          *pcVar4 = cVar7;
          pcVar3 = pcVar4 + (cVar7 != '\0');
          if (bVar8) {
LAB_003cf478:
            pcVar4 = pcVar4 + (cVar7 != '\0');
LAB_003cf488:
            wVar2 = L'\0';
LAB_003cf518:
            *pcVar4 = cVar7;
            iVar1 = fchdir(fd);
            if (iVar1 != 0) {
              if (a_eno != (wchar_t *)0x0) {
                pwVar5 = __errno_location();
                *a_eno = *pwVar5;
              }
              wVar2 = L'\xffffffe2';
              if (a_estr != (archive_string *)0x0) {
                archive_string_sprintf(a_estr,"%s%s","chdir() failure","");
              }
            }
            close(fd);
            return wVar2;
          }
          goto LAB_003cf28f;
        }
        if (bVar8) {
          iVar1 = unlink(pcVar6);
          *pcVar4 = cVar7;
          if (iVar1 == 0) goto LAB_003cf488;
          if (a_eno != (wchar_t *)0x0) {
            pwVar5 = __errno_location();
            *a_eno = *pwVar5;
          }
          wVar2 = L'\xffffffe7';
          if (a_estr == (archive_string *)0x0) goto LAB_003cf518;
          pcVar6 = "Could not remove symlink ";
        }
        else {
          if ((flags & 0x10U) == 0) {
            if (((uint)flags >> 8 & 1) == 0) {
              iVar1 = stat(pcVar6,&local_c0);
              if (iVar1 != 0) {
                *pcVar4 = cVar7;
                pwVar5 = __errno_location();
                wVar2 = *pwVar5;
                if (wVar2 != L'\x02') goto LAB_003cf3b4;
                goto LAB_003cf488;
              }
              if ((local_c0.st_mode & 0xf000) == 0x4000) goto LAB_003cf340;
            }
            *pcVar4 = cVar7;
            if (a_eno != (wchar_t *)0x0) {
              *a_eno = L'\0';
            }
            wVar2 = L'\xffffffe7';
            if (a_estr != (archive_string *)0x0) {
              pcVar6 = "Cannot extract through symlink ";
              goto LAB_003cf509;
            }
            goto LAB_003cf518;
          }
          iVar1 = unlink(pcVar6);
          if (iVar1 == 0) goto LAB_003cf366;
          *pcVar4 = cVar7;
          if (a_eno != (wchar_t *)0x0) {
            *a_eno = L'\0';
          }
          wVar2 = L'\xffffffe7';
          if (a_estr == (archive_string *)0x0) goto LAB_003cf518;
          pcVar6 = "Cannot remove intervening symlink ";
        }
      }
      else {
        *pcVar4 = cVar7;
        pwVar5 = __errno_location();
        wVar2 = *pwVar5;
        if (wVar2 == L'\x02') goto LAB_003cf488;
LAB_003cf3b4:
        if (a_eno != (wchar_t *)0x0) {
          *a_eno = wVar2;
        }
        wVar2 = L'\xffffffe7';
        if (a_estr == (archive_string *)0x0) goto LAB_003cf518;
        pcVar6 = "Could not stat ";
      }
LAB_003cf509:
      archive_string_sprintf(a_estr,"%s%s",pcVar6,path);
      goto LAB_003cf518;
    }
    wVar2 = L'\xffffffe2';
  }
  return wVar2;
}

Assistant:

static int
check_symlinks_fsobj(char *path, int *a_eno, struct archive_string *a_estr,
    int flags)
{
#if !defined(HAVE_LSTAT)
	/* Platform doesn't have lstat, so we can't look for symlinks. */
	(void)path; /* UNUSED */
	(void)error_number; /* UNUSED */
	(void)error_string; /* UNUSED */
	(void)flags; /* UNUSED */
	return (ARCHIVE_OK);
#else
	int res = ARCHIVE_OK;
	char *tail;
	char *head;
	int last;
	char c;
	int r;
	struct stat st;
	int restore_pwd;

	/* Nothing to do here if name is empty */
	if(path[0] == '\0')
	    return (ARCHIVE_OK);

	/*
	 * Guard against symlink tricks.  Reject any archive entry whose
	 * destination would be altered by a symlink.
	 *
	 * Walk the filename in chunks separated by '/'.  For each segment:
	 *  - if it doesn't exist, continue
	 *  - if it's symlink, abort or remove it
	 *  - if it's a directory and it's not the last chunk, cd into it
	 * As we go:
	 *  head points to the current (relative) path
	 *  tail points to the temporary \0 terminating the segment we're
	 *      currently examining
	 *  c holds what used to be in *tail
	 *  last is 1 if this is the last tail
	 */
	restore_pwd = open(".", O_RDONLY | O_BINARY | O_CLOEXEC);
	__archive_ensure_cloexec_flag(restore_pwd);
	if (restore_pwd < 0)
		return (ARCHIVE_FATAL);
	head = path;
	tail = path;
	last = 0;
	/* TODO: reintroduce a safe cache here? */
	/* Skip the root directory if the path is absolute. */
	if(tail == path && tail[0] == '/')
		++tail;
	/* Keep going until we've checked the entire name.
	 * head, tail, path all alias the same string, which is
	 * temporarily zeroed at tail, so be careful restoring the
	 * stashed (c=tail[0]) for error messages.
	 * Exiting the loop with break is okay; continue is not.
	 */
	while (!last) {
		/*
		 * Skip the separator we just consumed, plus any adjacent ones
		 */
		while (*tail == '/')
		    ++tail;
		/* Skip the next path element. */
		while (*tail != '\0' && *tail != '/')
			++tail;
		/* is this the last path component? */
		last = (tail[0] == '\0') || (tail[0] == '/' && tail[1] == '\0');
		/* temporarily truncate the string here */
		c = tail[0];
		tail[0] = '\0';
		/* Check that we haven't hit a symlink. */
		r = lstat(head, &st);
		if (r != 0) {
			tail[0] = c;
			/* We've hit a dir that doesn't exist; stop now. */
			if (errno == ENOENT) {
				break;
			} else {
				/*
				 * Treat any other error as fatal - best to be
				 * paranoid here.
				 * Note: This effectively disables deep
				 * directory support when security checks are
				 * enabled. Otherwise, very long pathnames that
				 * trigger an error here could evade the
				 * sandbox.
				 * TODO: We could do better, but it would
				 * probably require merging the symlink checks
				 * with the deep-directory editing.
				 */
				fsobj_error(a_eno, a_estr, errno,
				    "Could not stat ", path);
				res = ARCHIVE_FAILED;
				break;
			}
		} else if (S_ISDIR(st.st_mode)) {
			if (!last) {
				if (chdir(head) != 0) {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, errno,
					    "Could not chdir ", path);
					res = (ARCHIVE_FATAL);
					break;
				}
				/* Our view is now from inside this dir: */
				head = tail + 1;
			}
		} else if (S_ISLNK(st.st_mode)) {
			if (last) {
				/*
				 * Last element is symlink; remove it
				 * so we can overwrite it with the
				 * item being extracted.
				 */
				if (unlink(head)) {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, errno,
					    "Could not remove symlink ",
					    path);
					res = ARCHIVE_FAILED;
					break;
				}
				/*
				 * Even if we did remove it, a warning
				 * is in order.  The warning is silly,
				 * though, if we're just replacing one
				 * symlink with another symlink.
				 */
				tail[0] = c;
				/*
				 * FIXME:  not sure how important this is to
				 * restore
				 */
				/*
				if (!S_ISLNK(path)) {
					fsobj_error(a_eno, a_estr, 0,
					    "Removing symlink ", path);
				}
				*/
				/* Symlink gone.  No more problem! */
				res = ARCHIVE_OK;
				break;
			} else if (flags & ARCHIVE_EXTRACT_UNLINK) {
				/* User asked us to remove problems. */
				if (unlink(head) != 0) {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, 0,
					    "Cannot remove intervening "
					    "symlink ", path);
					res = ARCHIVE_FAILED;
					break;
				}
				tail[0] = c;
			} else if ((flags &
			    ARCHIVE_EXTRACT_SECURE_SYMLINKS) == 0) {
				/*
				 * We are not the last element and we want to
				 * follow symlinks if they are a directory.
				 * 
				 * This is needed to extract hardlinks over
				 * symlinks.
				 */
				r = stat(head, &st);
				if (r != 0) {
					tail[0] = c;
					if (errno == ENOENT) {
						break;
					} else {
						fsobj_error(a_eno, a_estr,
						    errno,
						    "Could not stat ", path);
						res = (ARCHIVE_FAILED);
						break;
					}
				} else if (S_ISDIR(st.st_mode)) {
					if (chdir(head) != 0) {
						tail[0] = c;
						fsobj_error(a_eno, a_estr,
						    errno,
						    "Could not chdir ", path);
						res = (ARCHIVE_FATAL);
						break;
					}
					/*
					 * Our view is now from inside
					 * this dir:
					 */
					head = tail + 1;
				} else {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, 0,
					    "Cannot extract through "
					    "symlink ", path);
					res = ARCHIVE_FAILED;
					break;
				}
			} else {
				tail[0] = c;
				fsobj_error(a_eno, a_estr, 0,
				    "Cannot extract through symlink ", path);
				res = ARCHIVE_FAILED;
				break;
			}
		}
		/* be sure to always maintain this */
		tail[0] = c;
		if (tail[0] != '\0')
			tail++; /* Advance to the next segment. */
	}
	/* Catches loop exits via break */
	tail[0] = c;
#ifdef HAVE_FCHDIR
	/* If we changed directory above, restore it here. */
	if (restore_pwd >= 0) {
		r = fchdir(restore_pwd);
		if (r != 0) {
			fsobj_error(a_eno, a_estr, errno,
			    "chdir() failure", "");
		}
		close(restore_pwd);
		restore_pwd = -1;
		if (r != 0) {
			res = (ARCHIVE_FATAL);
		}
	}
#endif
	/* TODO: reintroduce a safe cache here? */
	return res;
#endif
}